

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_setup(BuildCtx *ctx,void *actionlist)

{
  dasm_State *pdVar1;
  int local_24;
  int i;
  dasm_State *D;
  void *actionlist_local;
  BuildCtx *ctx_local;
  
  pdVar1 = ctx->D;
  pdVar1->actionlist = (dasm_ActList)actionlist;
  pdVar1->status = 0;
  pdVar1->section = pdVar1->sections;
  memset(pdVar1->lglabels,0,pdVar1->lgsize);
  if (pdVar1->pclabels != (int *)0x0) {
    memset(pdVar1->pclabels,0,pdVar1->pcsize);
  }
  for (local_24 = 0; local_24 < pdVar1->maxsection; local_24 = local_24 + 1) {
    pdVar1->sections[local_24].pos = local_24 << 0x18;
    pdVar1->sections[local_24].rbuf =
         pdVar1->sections[local_24].buf + -(long)pdVar1->sections[local_24].pos;
    pdVar1->sections[local_24].ofs = 0;
  }
  return;
}

Assistant:

void dasm_setup(Dst_DECL, const void *actionlist)
{
  dasm_State *D = Dst_REF;
  int i;
  D->actionlist = (dasm_ActList)actionlist;
  D->status = DASM_S_OK;
  D->section = &D->sections[0];
  memset((void *)D->lglabels, 0, D->lgsize);
  if (D->pclabels) memset((void *)D->pclabels, 0, D->pcsize);
  for (i = 0; i < D->maxsection; i++) {
    D->sections[i].pos = DASM_SEC2POS(i);
    D->sections[i].rbuf = D->sections[i].buf - D->sections[i].pos;
    D->sections[i].ofs = 0;
  }
}